

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O2

void __thiscall TcpServerImpl::~TcpServerImpl(TcpServerImpl *this)

{
  (this->super_BaseSocketImpl)._vptr_BaseSocketImpl = (_func_int **)&PTR__TcpServerImpl_001454d8;
  std::function<void_(const_std::vector<TcpSocket_*,_std::allocator<TcpSocket_*>_>_&)>::operator=
            (&this->m_fNewConnection,(nullptr_t)0x0);
  (this->super_BaseSocketImpl).m_bStop = true;
  if ((this->super_BaseSocketImpl).m_thListen._M_id._M_thread != 0) {
    std::thread::join();
  }
  Delete(this);
  std::_Function_base::~_Function_base(&(this->m_fNewConnectionParam).super__Function_base);
  std::_Function_base::~_Function_base(&(this->m_fNewConnection).super__Function_base);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->m_vSock).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->m_vSockAccept).super__Vector_base<int,_std::allocator<int>_>);
  BaseSocketImpl::~BaseSocketImpl(&this->super_BaseSocketImpl);
  return;
}

Assistant:

TcpServerImpl::~TcpServerImpl()
{
    m_fNewConnection = nullptr;
    m_bStop = true; // Stops the listening thread

    if (m_thListen.joinable() == true)
        m_thListen.join();
    Delete();
}